

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdapi_elements_transaction.cpp
# Opt level: O3

void __thiscall
ElementsTransactionApi_FundRawTransaction_Check1_Test::TestBody
          (ElementsTransactionApi_FundRawTransaction_Check1_Test *this)

{
  pointer pTVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  pointer hex;
  long lVar5;
  char *pcVar6;
  ulong uVar7;
  pointer pCVar8;
  initializer_list<TestFundElementsUtxoVector> __l;
  AssertionResult gtest_ar;
  ElementsTransactionApi api;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  append_txout_addresses;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext context;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  selected_txin_utxos;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> selected_utxos;
  UtxoFilter filter;
  ElementsAddressFactory factory;
  ElementsUtxoAndOption txin_utxo;
  ConfidentialAssetId fee_asset;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  map_target_value;
  CoinSelectionOption option;
  Amount estimate_fee;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  reserve_txout_address;
  ExtPubkey key;
  ElementsConfidentialAddress ct_addr1;
  ConfidentialTransactionController ctx;
  Address addr3;
  Address addr2;
  Address addr1;
  ElementsConfidentialAddress reserve_ct_addr1;
  Address addr;
  ConfidentialTransactionContext tx;
  ElementsConfidentialAddress reserve_ct_addr3;
  ElementsConfidentialAddress reserve_ct_addr2;
  Txid local_16f8;
  undefined1 local_16d8 [47];
  ElementsTransactionApi local_16a9;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_16a8;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1688;
  undefined1 local_1670 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1668;
  _func_int *local_1660 [21];
  string local_15b8;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  local_1598;
  vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  local_1578;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> local_1558;
  pointer local_1540;
  UtxoFilter local_1534;
  string local_1530;
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  local_1510;
  AddressFactory local_14f8;
  undefined1 local_14d0 [9];
  undefined7 uStack_14c7;
  undefined *local_14c0 [2];
  uint32_t local_14b0;
  undefined1 local_14a8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1490;
  _Alloc_hider local_1480;
  pointer local_1478;
  _func_int *local_1470 [2];
  pointer local_1460 [2];
  undefined1 local_1450 [32];
  string local_1430;
  uchar *local_1410 [2];
  uchar local_1400 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_13f0;
  undefined1 local_13e0 [16];
  undefined4 local_13d0;
  pointer local_13c8;
  string local_13c0;
  uchar *local_13a0 [2];
  uchar local_1390 [16];
  uchar *local_1380 [2];
  uchar local_1370 [16];
  undefined4 local_1360;
  pointer local_1358;
  string local_1350;
  pointer local_1330 [2];
  undefined1 local_1320 [16];
  ByteData256 *local_1310;
  ByteData256 local_1300;
  pointer local_12e8;
  string local_12e0;
  pointer local_12c0 [2];
  undefined1 local_12b0 [16];
  _func_int **local_12a0;
  undefined1 local_1298 [8];
  _func_int *local_1290 [3];
  pointer local_1278;
  bool local_1270 [8];
  AddressType local_1268;
  undefined1 local_1258 [8];
  pointer local_1250;
  undefined1 local_1240 [16];
  _func_int **local_1230;
  _func_int *local_1220 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1210;
  string local_1200;
  pointer local_11e0 [2];
  undefined1 local_11d0 [16];
  _func_int **local_11c0;
  _func_int *local_11b0 [2];
  undefined4 local_11a0;
  pointer local_1198;
  string local_1190;
  pointer local_1170 [2];
  undefined1 local_1160 [16];
  pointer local_1150;
  undefined1 local_1140 [64];
  pointer local_1100 [2];
  undefined1 local_10f0 [16];
  pointer local_10e0;
  undefined1 local_10d0 [64];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1090;
  undefined1 local_1080 [16];
  pointer local_1070 [2];
  undefined1 local_1060 [64];
  pointer local_1020 [2];
  undefined1 local_1010 [16];
  pointer local_1000;
  undefined1 local_ff0 [24];
  undefined1 local_fd8 [40];
  pointer local_fb0 [2];
  undefined1 local_fa0 [24];
  pointer local_f88;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  local_f68;
  CoinSelectionOption local_f38;
  Privkey local_ed0;
  Pubkey local_eb0;
  Amount local_e98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_e88;
  ExtPubkey local_e58;
  SigHashType local_de4;
  undefined1 local_dd8 [16];
  _func_int *local_dc8 [52];
  ConfidentialTransactionController local_c28;
  Address local_bd8;
  Address local_a60;
  Address local_8e8;
  ElementsConfidentialAddress local_770;
  Address local_5c0;
  ConfidentialTransactionContext local_448;
  ElementsConfidentialAddress local_390;
  ElementsConfidentialAddress local_1e0;
  
  if (TestBody()::kFundCoinSelectElementsTestVector3 == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::kFundCoinSelectElementsTestVector3);
    if (iVar4 != 0) {
      local_14d0._0_8_ = local_14c0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_14d0,
                 "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a","");
      local_14b0 = 0;
      local_14a8._0_8_ = &DAT_12a05f20;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_14a8 + 8),&exp_dummy_asset_a);
      local_1480._M_p = (pointer)local_1470;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1480,
                 "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))","");
      local_1460[0] = (pointer)local_1450;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1460,
                 "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a","");
      local_1450._16_4_ = 0;
      local_1450._24_8_ = &DAT_04a817c8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1430,&exp_dummy_asset_a);
      local_1410[0] = local_1400;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1410,
                 "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))","");
      local_13f0._M_allocated_capacity = (size_type)local_13e0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_13f0,
                 "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a","");
      local_13d0 = 0;
      local_13c8 = &DAT_4a817c80;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_13c0,&exp_dummy_asset_a);
      local_13a0[0] = local_1390;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_13a0,
                 "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))","");
      local_1380[0] = local_1370;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1380,
                 "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a","");
      local_1360 = 0;
      local_1358 = (pointer)&DAT_02540be4;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1350,&exp_dummy_asset_a);
      local_1330[0] = (pointer)local_1320;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1330,
                 "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))","");
      local_1310 = &local_1300;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1310,
                 "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a","");
      local_1300.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_12e8 = (pointer)&DAT_09502f90;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_12e0,&exp_dummy_asset_a);
      local_12c0[0] = (pointer)local_12b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_12c0,
                 "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))","");
      local_12a0 = local_1290;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_12a0,
                 "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b","");
      local_1290[2]._0_4_ = 0;
      local_1278 = (pointer)0x9502f900;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_1270,&exp_dummy_asset_a);
      local_1250 = (pointer)local_1240;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1250,
                 "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))","");
      local_1230 = local_1220;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1230,
                 "0000000000000000000000000000000000000000000000000000000000000b01","");
      local_1210._M_allocated_capacity._0_4_ = 0;
      local_1210._8_8_ = &DAT_019abe00;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1200,&exp_dummy_asset_b);
      local_11e0[0] = (pointer)local_11d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_11e0,
                 "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))","");
      local_11c0 = local_11b0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_11c0,
                 "0000000000000000000000000000000000000000000000000000000000000b02","");
      local_11a0 = 0;
      local_1198 = (pointer)&DAT_000b71b0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_1190,&exp_dummy_asset_b);
      local_1170[0] = (pointer)local_1160;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1170,
                 "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))","");
      local_1150 = (pointer)local_1140;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1150,
                 "0000000000000000000000000000000000000000000000000000000000000b03","");
      local_1140._16_4_ = 0;
      local_1140._24_8_ = &DAT_14a61a62;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_1140 + 0x20),&exp_dummy_asset_b);
      local_1100[0] = (pointer)local_10f0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1100,
                 "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))","");
      local_10e0 = (pointer)local_10d0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_10e0,
                 "0000000000000000000000000000000000000000000000000000000000000b04","");
      local_10d0._16_4_ = 0;
      local_10d0._24_8_ = &DAT_0119ed3e;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_10d0 + 0x20),&exp_dummy_asset_b);
      local_1090._M_allocated_capacity = (size_type)local_1080;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1090,
                 "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))","");
      local_1070[0] = (pointer)local_1060;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1070,
                 "0000000000000000000000000000000000000000000000000000000000000c01","");
      local_1060._16_4_ = 0;
      local_1060._24_8_ = &DAT_023e8eb8;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_1060 + 0x20),&exp_dummy_asset_c);
      local_1020[0] = (pointer)local_1010;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1020,
                 "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))","");
      local_1000 = (pointer)local_ff0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1000,
                 "0000000000000000000000000000000000000000000000000000000000000c02","");
      local_ff0._16_4_ = 0;
      local_fd8._0_8_ = &DAT_079252f0;
      cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_
                ((string *)(local_fd8 + 8),&exp_dummy_asset_c);
      local_fb0[0] = (pointer)local_fa0;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_fb0,
                 "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))","");
      __l._M_len = 0xc;
      __l._M_array = (iterator)local_14d0;
      std::vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::vector
                (&TestBody::kFundCoinSelectElementsTestVector3,__l,(allocator_type *)local_dd8);
      lVar5 = 0x4d0;
      do {
        TestFundElementsUtxoVector::~TestFundElementsUtxoVector
                  ((TestFundElementsUtxoVector *)(local_14d0 + lVar5));
        lVar5 = lVar5 + -0x70;
      } while (lVar5 != -0x70);
      __cxa_atexit(std::
                   vector<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>::
                   ~vector,&TestBody::kFundCoinSelectElementsTestVector3,&__dso_handle);
      __cxa_guard_release(&TestBody()::kFundCoinSelectElementsTestVector3);
    }
  }
  if (TestBody()::kExpTxData_abi_cxx11_ == '\0') {
    iVar4 = __cxa_guard_acquire(&TestBody()::kExpTxData_abi_cxx11_);
    if (iVar4 != 0) {
      TestBody()::kExpTxData_abi_cxx11_._M_dataplus._M_p =
           (pointer)&TestBody()::kExpTxData_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&TestBody()::kExpTxData_abi_cxx11_,
                 "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000"
                 ,"");
      __cxa_atexit(std::__cxx11::string::~string,&TestBody()::kExpTxData_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&TestBody()::kExpTxData_abi_cxx11_);
    }
  }
  cfd::Initialize();
  cfd::ElementsAddressFactory::ElementsAddressFactory
            ((ElementsAddressFactory *)&local_14f8,kLiquidV1);
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,
             "010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000"
             ,"");
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            (&local_448,(string *)local_14d0);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::resize
            (&local_1688,
             ((long)TestBody::kFundCoinSelectElementsTestVector3.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)TestBody::kFundCoinSelectElementsTestVector3.
                    super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4) * 0x6db6db6db6db6db7);
  pTVar1 = TestBody::kFundCoinSelectElementsTestVector3.
           super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      TestBody::kFundCoinSelectElementsTestVector3.
      super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    uVar7 = 0;
    hex = TestBody::kFundCoinSelectElementsTestVector3.
          super__Vector_base<TestFundElementsUtxoVector,_std::allocator<TestFundElementsUtxoVector>_>
          ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid((Txid *)local_dd8);
      if ((hex->txid)._M_string_length != 0) {
        cfd::core::Txid::Txid((Txid *)local_14d0,&hex->txid);
        cfd::core::Txid::operator=((Txid *)local_dd8,(Txid *)local_14d0);
        local_14d0._0_8_ = &PTR__Txid_00723450;
        if ((void *)CONCAT71(uStack_14c7,local_14d0[8]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(uStack_14c7,local_14d0[8]));
        }
      }
      cfd::core::Txid::Txid((Txid *)local_14d0,&hex->txid);
      cfd::core::Txid::operator=
                (&local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7].txid,(Txid *)local_14d0);
      local_14d0._0_8_ = &PTR__Txid_00723450;
      if ((void *)CONCAT71(uStack_14c7,local_14d0[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(uStack_14c7,local_14d0[8]));
      }
      local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7].vout = hex->vout;
      cfd::core::Amount::Amount((Amount *)local_14d0,hex->amount);
      local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7].amount.ignore_check_ = (bool)local_14d0[8];
      local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7].amount.amount_ = local_14d0._0_8_;
      cfd::core::ConfidentialAssetId::ConfidentialAssetId
                ((ConfidentialAssetId *)local_14d0,&hex->asset);
      cfd::core::ConfidentialAssetId::operator=
                (&local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7].asset,
                 (ConfidentialAssetId *)local_14d0);
      local_14d0._0_8_ = &PTR__ConfidentialAssetId_00723760;
      if ((void *)CONCAT71(uStack_14c7,local_14d0[8]) != (void *)0x0) {
        operator_delete((void *)CONCAT71(uStack_14c7,local_14d0[8]));
      }
      std::__cxx11::string::_M_assign
                ((string *)
                 &local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar7].descriptor);
      local_1688.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7].address_type = kP2shP2wpkhAddress;
      local_dd8._0_8_ = &PTR__Txid_00723450;
      if ((pointer)local_dd8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_dd8._8_8_);
      }
      hex = hex + 1;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (hex != pTVar1);
  }
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,
             "xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy"
             ,"");
  cfd::core::ExtPubkey::ExtPubkey(&local_e58,(string *)local_14d0);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)(local_fa0 + 0x10),&exp_dummy_asset_a);
  local_f68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_f68._M_impl.super__Rb_tree_header._M_header;
  local_f68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_f68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_f68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_f68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_f68._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_14d0,&exp_dummy_asset_a);
  cfd::core::Amount::Amount((Amount *)local_dd8,0x6e6f7c0);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14d0,
             (Amount *)local_dd8);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_14d0,&exp_dummy_asset_b);
  cfd::core::Amount::Amount((Amount *)local_dd8,0x14b18c08);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14d0,
             (Amount *)local_dd8);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_14d0,&exp_dummy_asset_c);
  cfd::core::Amount::Amount((Amount *)local_dd8,0x23e8e54);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
  ::_M_emplace_unique<std::__cxx11::string,cfd::core::Amount>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cfd::core::Amount>,std::_Select1st<std::pair<std::__cxx11::string_const,cfd::core::Amount>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cfd::core::Amount>>>
              *)&local_f68,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14d0,
             (Amount *)local_dd8);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,"ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h","");
  cfd::AddressFactory::GetAddress(&local_5c0,&local_14f8,(string *)local_14d0);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,"ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e","");
  cfd::AddressFactory::GetAddress(&local_8e8,&local_14f8,(string *)local_14d0);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,"ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn","");
  cfd::AddressFactory::GetAddress(&local_a60,&local_14f8,(string *)local_14d0);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_14d0._0_8_ = local_14c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_14d0,"ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m","");
  cfd::AddressFactory::GetAddress(&local_bd8,&local_14f8,(string *)local_14d0);
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_e88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e88._M_impl.super__Rb_tree_header._M_header;
  local_e88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e88._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e88._M_impl.super__Rb_tree_header._M_header._M_left;
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_14d0,&exp_dummy_asset_a);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_dd8,&local_8e8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8);
  if ((_func_int **)local_dd8._0_8_ != local_dc8) {
    operator_delete((void *)local_dd8._0_8_);
  }
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_14d0,&exp_dummy_asset_b);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_dd8,&local_a60);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8);
  if ((_func_int **)local_dd8._0_8_ != local_dc8) {
    operator_delete((void *)local_dd8._0_8_);
  }
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_((string *)local_14d0,&exp_dummy_asset_c);
  cfd::core::Address::GetAddress_abi_cxx11_((string *)local_dd8,&local_bd8);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  ::_M_emplace_unique<std::__cxx11::string,std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
              *)&local_e88,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_14d0,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dd8);
  if ((_func_int **)local_dd8._0_8_ != local_dc8) {
    operator_delete((void *)local_dd8._0_8_);
  }
  if ((undefined **)local_14d0._0_8_ != local_14c0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14d0,&local_e58,0x5a);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_770,(ExtPubkey *)local_14d0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_dd8,&local_5c0,(ConfidentialKey *)&local_770);
  if ((pointer)local_770.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_770.unblinded_address_._0_8_);
  }
  if (local_1478 != (pointer)0x0) {
    operator_delete(local_1478);
  }
  if ((pointer)local_1490._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1490._M_allocated_capacity);
  }
  if ((_func_int **)local_14a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14a8._0_8_);
  }
  if ((undefined **)local_14d0._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14d0,&local_e58,0x5b);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_1e0,(ExtPubkey *)local_14d0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_770,&local_8e8,(ConfidentialKey *)&local_1e0);
  if ((pointer)local_1e0.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e0.unblinded_address_._0_8_);
  }
  if (local_1478 != (pointer)0x0) {
    operator_delete(local_1478);
  }
  if ((pointer)local_1490._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1490._M_allocated_capacity);
  }
  if ((_func_int **)local_14a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14a8._0_8_);
  }
  if ((undefined **)local_14d0._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14d0,&local_e58,0x5c);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)&local_390,(ExtPubkey *)local_14d0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_1e0,&local_a60,(ConfidentialKey *)&local_390);
  if ((pointer)local_390.unblinded_address_._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_390.unblinded_address_._0_8_);
  }
  if (local_1478 != (pointer)0x0) {
    operator_delete(local_1478);
  }
  if ((pointer)local_1490._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1490._M_allocated_capacity);
  }
  if ((_func_int **)local_14a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14a8._0_8_);
  }
  if ((undefined **)local_14d0._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  cfd::core::ExtPubkey::DerivePubkey((ExtPubkey *)local_14d0,&local_e58,0x5d);
  cfd::core::ExtPubkey::GetPubkey((Pubkey *)local_1670,(ExtPubkey *)local_14d0);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress
            (&local_390,&local_bd8,(ConfidentialKey *)local_1670);
  if (local_1670 != (undefined1  [8])0x0) {
    operator_delete((void *)local_1670);
  }
  if (local_1478 != (pointer)0x0) {
    operator_delete(local_1478);
  }
  if ((pointer)local_1490._M_allocated_capacity != (pointer)0x0) {
    operator_delete((void *)local_1490._M_allocated_capacity);
  }
  if ((_func_int **)local_14a8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_14a8._0_8_);
  }
  if ((undefined **)local_14d0._0_8_ != (undefined **)0x0) {
    operator_delete((void *)local_14d0._0_8_);
  }
  local_1558.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1558.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1558.super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1578.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1578.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1578.
  super__Vector_base<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  cfd::UtxoData::UtxoData((UtxoData *)local_14d0);
  local_ff0._16_4_ = local_ff0._16_4_ & 0xff000000;
  local_ff0._20_4_ = 0;
  cfd::core::Script::Script((Script *)local_fd8);
  local_fa0._0_4_ = 0;
  local_f38._0_8_ = (long)&local_f38 + 0x10U;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f38,"9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff"
             ,"");
  cfd::core::Txid::Txid((Txid *)local_1670,(string *)&local_f38);
  cfd::core::Txid::operator=((Txid *)local_14a8,(Txid *)local_1670);
  local_1670 = (undefined1  [8])&PTR__Txid_00723450;
  if ((void *)CONCAT71(local_1668.ptr_._1_7_,local_1668.ptr_._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_1668.ptr_._1_7_,local_1668.ptr_._0_1_));
  }
  if (local_f38._0_8_ != (long)&local_f38 + 0x10U) {
    operator_delete((void *)local_f38._0_8_);
  }
  cfd::core::Amount::Amount((Amount *)local_1670,0x6b22c20);
  local_1270[0] = local_1668.ptr_._0_1_;
  local_1278 = (pointer)local_1670;
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)local_1258,&exp_dummy_asset_a);
  std::__cxx11::string::_M_replace((ulong)local_1298,0,(char *)local_1290[0],0x57d135);
  local_1268 = kP2shP2wpkhAddress;
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  push_back(&local_1578,(value_type *)local_14d0);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::push_back
            (&local_1558,(value_type *)local_14d0);
  cfd::core::Amount::Amount(&local_e98);
  local_16a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_16a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_16a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::CoinSelectionOption::CoinSelectionOption(&local_f38);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(&local_f38);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate(&local_f38,0.15);
  cfd::CoinSelectionOption::SetLongTermFeeBaserate(&local_f38,0.15);
  cfd::CoinSelectionOption::SetFeeAsset(&local_f38,(ConfidentialAssetId *)(local_fa0 + 0x10));
  cfd::CoinSelectionOption::SetBlindInfo(&local_f38,0,0x24);
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            ((string *)local_1670,(AbstractTransaction *)&local_448);
  cfd::api::ElementsTransactionApi::FundRawTransaction
            (&local_c28,&local_16a9,(string *)local_1670,&local_1688,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
              *)&local_f68,&local_1578,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_e88,(ConfidentialAssetId *)(local_fa0 + 0x10),true,0.15,&local_e98,
             &local_1534,&local_f38,&local_16a8,kCfdOutOfRangeError,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0,(Amount *)0x0);
  if (local_1670 != (undefined1  [8])local_1660) {
    operator_delete((void *)local_1670);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_1670,&local_c28.super_AbstractTransactionController);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_16d8,"kExpTxData","ctx.GetHex()",&TestBody()::kExpTxData_abi_cxx11_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1670);
  if (local_1670 != (undefined1  [8])local_1660) {
    operator_delete((void *)local_1670);
  }
  if (local_16d8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1670);
    if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)local_16d8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x618,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    if (local_1670 != (undefined1  [8])0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && (local_1670 != (undefined1  [8])0x0)) {
        (**(code **)(*(_func_int **)local_1670 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_16d8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  local_16f8._vptr_Txid = (_func_int **)CONCAT44(local_16f8._vptr_Txid._4_4_,0x26a);
  local_16d8._0_8_ = cfd::core::Amount::GetSatoshiValue(&local_e98);
  testing::internal::CmpHelperEQ<int,long>
            ((internal *)local_1670,"618","estimate_fee.GetSatoshiValue()",(int *)&local_16f8,
             (long *)local_16d8);
  if (local_1670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_16d8);
    if ((undefined8 *)CONCAT71(local_1668.ptr_._1_7_,local_1668.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_1668.ptr_._1_7_,local_1668.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x619,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_16d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_16d8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_16d8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1668,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_16d8._0_8_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3;
  local_16f8._vptr_Txid =
       (_func_int **)
       ((long)local_16a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_16a8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1670,"size_t{3}","append_txout_addresses.size()",
             (unsigned_long *)local_16d8,(unsigned_long *)&local_16f8);
  if (local_1670[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_16d8);
    if ((undefined8 *)CONCAT71(local_1668.ptr_._1_7_,local_1668.ptr_._0_1_) == (undefined8 *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = *(char **)CONCAT71(local_1668.ptr_._1_7_,local_1668.ptr_._0_1_);
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_16f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
               ,0x61a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_16d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_16d8._0_8_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_16d8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1668,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long)local_16a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_16a8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start == 0x60) {
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1670,&local_8e8);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_16d8,"addr1.GetAddress().c_str()",
               "append_txout_addresses[2].c_str()",(char *)local_1670,
               local_16a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[2]._M_dataplus._M_p);
    if (local_1670 != (undefined1  [8])local_1660) {
      operator_delete((void *)local_1670);
    }
    if (local_16d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1670);
      if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_16d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61d,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      if (local_1670 != (undefined1  [8])0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_1670 != (undefined1  [8])0x0)) {
          (**(code **)(*(_func_int **)local_1670 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_16d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1670,&local_a60);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_16d8,"addr2.GetAddress().c_str()",
               "append_txout_addresses[0].c_str()",(char *)local_1670,
               ((local_16a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    if (local_1670 != (undefined1  [8])local_1660) {
      operator_delete((void *)local_1670);
    }
    if (local_16d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1670);
      if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_16d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61e,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      if (local_1670 != (undefined1  [8])0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_1670 != (undefined1  [8])0x0)) {
          (**(code **)(*(_func_int **)local_1670 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_16d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)local_1670,&local_bd8);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_16d8,"addr3.GetAddress().c_str()",
               "append_txout_addresses[1].c_str()",(char *)local_1670,
               local_16a8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p);
    if (local_1670 != (undefined1  [8])local_1660) {
      operator_delete((void *)local_1670);
    }
    if (local_16d8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_1670);
      if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = *(char **)local_16d8._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_16f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                 ,0x61f,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_16f8,(Message *)local_1670);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_16f8);
      if (local_1670 != (undefined1  [8])0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && (local_1670 != (undefined1  [8])0x0)) {
          (**(code **)(*(_func_int **)local_1670 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)(local_16d8 + 8),
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_
            ((string *)local_16d8,&local_c28.super_AbstractTransactionController);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1670,(string *)local_16d8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_16d8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_16d8 + 0x10)
     ) {
    operator_delete((void *)local_16d8._0_8_);
  }
  local_1598.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1598.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1598.
  super__Vector_base<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,(value_type *)local_dd8);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,&local_770);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,&local_1e0);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back(&local_1598,&local_390);
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)local_1670,&local_1558);
  cfd::ConfidentialTransactionContext::CollectInputUtxo
            ((ConfidentialTransactionContext *)local_1670,&local_1688);
  cfd::ConfidentialTransactionContext::Blind
            ((ConfidentialTransactionContext *)local_1670,&local_1598,1,0,0x24,
             (vector<cfd::core::BlindData,_std::allocator<cfd::core::BlindData>_> *)0x0);
  cfd::core::ConfidentialTransaction::GetTxInList(&local_1510,(ConfidentialTransaction *)local_1670)
  ;
  local_1540 = local_1510.
               super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1510.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1510.
      super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pCVar8 = local_1510.
             super__Vector_base<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      cfd::core::Txid::Txid(&local_16f8,&(pCVar8->super_AbstractTxInReference).txid_);
      cfd::core::OutPoint::OutPoint
                ((OutPoint *)local_16d8,&local_16f8,(pCVar8->super_AbstractTxInReference).vout_);
      local_15b8._M_dataplus._M_p = (pointer)&local_15b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_15b8,
                 "0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b","");
      cfd::core::Pubkey::Pubkey(&local_eb0,&local_15b8);
      local_1530._M_dataplus._M_p = (pointer)&local_1530.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1530,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5","");
      cfd::core::Privkey::FromWif(&local_ed0,&local_1530,kCustomChain,true);
      cfd::core::SigHashType::SigHashType(&local_de4);
      cfd::ConfidentialTransactionContext::SignWithKey
                ((ConfidentialTransactionContext *)local_1670,(OutPoint *)local_16d8,&local_eb0,
                 &local_ed0,&local_de4,true);
      if (local_ed0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_ed0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1530._M_dataplus._M_p != &local_1530.field_2) {
        operator_delete(local_1530._M_dataplus._M_p);
      }
      if (local_eb0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_eb0.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_15b8._M_dataplus._M_p != &local_15b8.field_2) {
        operator_delete(local_15b8._M_dataplus._M_p);
      }
      local_16d8._0_8_ = &PTR__Txid_00723450;
      if ((pointer)local_16d8._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_16d8._8_8_);
      }
      local_16f8._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
      if (local_16f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_16f8.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != local_1540);
  }
  std::
  vector<cfd::core::ConfidentialTxInReference,_std::allocator<cfd::core::ConfidentialTxInReference>_>
  ::~vector(&local_1510);
  uVar3 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1670);
  if (uVar3 != 0x1018) {
    uVar3 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1670);
    if (uVar3 != 0x1019) {
      uVar3 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1670);
      if (uVar3 != 0x101a) {
        local_16f8._vptr_Txid = (_func_int **)CONCAT44(local_16f8._vptr_Txid._4_4_,100);
        uVar3 = cfd::core::ConfidentialTransaction::GetVsize((ConfidentialTransaction *)local_1670);
        local_15b8._M_dataplus._M_p._0_4_ = uVar3;
        testing::internal::CmpHelperEQ<int,unsigned_int>
                  ((internal *)local_16d8,"100","context.GetVsize()",(int *)&local_16f8,
                   (uint *)&local_15b8);
        if (local_16d8[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_16f8);
          if ((pointer)local_16d8._8_8_ == (pointer)0x0) {
            pcVar6 = "";
          }
          else {
            pcVar6 = *(char **)local_16d8._8_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_15b8,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfdapi_elements_transaction.cpp"
                     ,0x633,pcVar6);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&local_15b8,(Message *)&local_16f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_15b8);
          if (local_16f8._vptr_Txid != (_func_int **)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) && (local_16f8._vptr_Txid != (_func_int **)0x0)) {
              (**(code **)(*local_16f8._vptr_Txid + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_16d8 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector(&local_1598);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_1670);
  local_c28.super_AbstractTransactionController._vptr_AbstractTransactionController =
       (_func_int **)&PTR__ConfidentialTransactionController_007233d8;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction(&local_c28.transaction_);
  local_f38.fee_asset_._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00723760;
  if (local_f38.fee_asset_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f38.fee_asset_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_16a8);
  cfd::core::Script::~Script((Script *)local_fd8);
  cfd::UtxoData::~UtxoData((UtxoData *)local_14d0);
  std::vector<cfd::api::ElementsUtxoAndOption,_std::allocator<cfd::api::ElementsUtxoAndOption>_>::
  ~vector(&local_1578);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1558);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_390);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_1e0);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress(&local_770);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)local_dd8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_e88);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_bd8.format_data_);
  cfd::core::Script::~Script(&local_bd8.redeem_script_);
  local_bd8.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_bd8.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_bd8.script_tree_.super_TapBranch);
  if (local_bd8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd8.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_bd8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_bd8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_bd8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_bd8.address_._M_dataplus._M_p != &local_bd8.address_.field_2) {
    operator_delete(local_bd8.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_a60.format_data_);
  cfd::core::Script::~Script(&local_a60.redeem_script_);
  local_a60.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_a60.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_a60.script_tree_.super_TapBranch);
  if (local_a60.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a60.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a60.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a60.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_a60.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a60.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a60.address_._M_dataplus._M_p != &local_a60.address_.field_2) {
    operator_delete(local_a60.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_8e8.format_data_);
  cfd::core::Script::~Script(&local_8e8.redeem_script_);
  local_8e8.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_8e8.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_8e8.script_tree_.super_TapBranch);
  if (local_8e8.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8e8.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8e8.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8e8.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_8e8.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_8e8.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8e8.address_._M_dataplus._M_p != &local_8e8.address_.field_2) {
    operator_delete(local_8e8.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_5c0.format_data_);
  cfd::core::Script::~Script(&local_5c0.redeem_script_);
  local_5c0.script_tree_.super_TapBranch._vptr_TapBranch =
       (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            (&local_5c0.script_tree_.nodes_);
  cfd::core::TapBranch::~TapBranch(&local_5c0.script_tree_.super_TapBranch);
  if (local_5c0.schnorr_pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c0.schnorr_pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5c0.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c0.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5c0.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_5c0.hash_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5c0.address_._M_dataplus._M_p != &local_5c0.address_.field_2) {
    operator_delete(local_5c0.address_._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::Amount>_>_>
  ::~_Rb_tree(&local_f68);
  local_fa0._16_8_ = &PTR__ConfidentialAssetId_00723760;
  if (local_f88 != (pointer)0x0) {
    operator_delete(local_f88);
  }
  if (local_e58.tweak_sum_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.tweak_sum_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e58.pubkey_.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.pubkey_.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e58.chaincode_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.chaincode_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e58.serialize_data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e58.serialize_data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector(&local_1688);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_448);
  local_14f8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_14f8.prefix_list_);
  return;
}

Assistant:

TEST(ElementsTransactionApi, FundRawTransaction_Check1) {
  // from cfd-go
  static const std::vector<TestFundElementsUtxoVector> kFundCoinSelectElementsTestVector3 = {
    // mnemonic: token hair neglect leader furnace obtain sadness tool you father paddle skate remain carry impact dinosaur correct essay rent illness predict mercy exist ring
    // xpriv: xprv9s21ZrQH143K4QXrTfC9L43GKCuLcDiBCWjyVqfZUTzoPJWUstD4HTJKGz1U5jAGZzKshcX6cCyZ1ZdxSUQLz92pEZWEGwxa39ks2vhTsfA
    // derive: 44h/0h/0h/0/*
    {
      "7ca81dd22c934747f4f5ab7844178445fe931fb248e0704c062b8f4fbd3d500a",
      0,
      312500000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(0329165ca5832de80305c92d4b1415f10340d267ba05cbffcfe02d386dc5020e4d))",
    },
    {
      "30f71f39d210f7ee291b0969c6935debf11395b0935dca84d30c810a75339a0a",
      0,
      78125000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(022db3cb17d98db6cd8d513f88b095dbe80ef9e57acd5b1d9e8bd7f24618079451))",
    },
    {
      "9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a",
      0,
      1250000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(032d04e0b1474a82ad68c0ef37e1a7cf6c75ef01b22c00882e8e4e127a942823a1))",
    },
    {
      "8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a",
      0,
      39062500,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(03a7fb569db921abf70f1b6b9ad9ac863196deecd99d606b139bba7d740d1cc5bf))",
    },
    {
      "4d97d0119b90421818bff4ec9033e5199199b53358f56390cb20f8148e76f40a",
      0,
      156250000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(02df74fc8124ff6f3982e90afb318f3e955b10f58c4c6014b3a767e16160f811d9))",
    },
    {
      "b9720ed2265a4ced42425bffdb4ef90a473b4106811a802fce53f7c57487fa0b",
      0,
      2500000000,
      exp_dummy_asset_a.GetHex(),
      "sh(wpkh(029222484db385d268a2a4604ea40fd2228401061f741ad9da8c907ba9df29c2d3))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b01",
      0,
      26918400,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(038f9011753b74fa0134d4b64a1491f99e0c4c0e16da616627c1f6a93c5e7555c0))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b02",
      0,
      750000,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(0302f567f9671b570dbcf179f3ba5f2fb381ea7e8db6ab9e0968c07d40325c3fcd))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b03",
      0,
      346430050,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(034ff60d8fb18ae88019f6f905cfaa0e1841f75edfa1f3c0a5bfaf77b796243901))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000b04",
      0,
      18476350,
      exp_dummy_asset_b.GetHex(),
      "sh(wpkh(029f2126cd8b55af7cc3cee8154c44de7cb7cb214809f81144d6b323d9c7a3993e))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c01",
      0,
      37654200,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02f1d2c28388e3fd609ff383f022b615f1cd8a1931632706f63bfb6e253875ca03))",
    },
    {
      "0000000000000000000000000000000000000000000000000000000000000c02",
      0,
      127030000,
      exp_dummy_asset_c.GetHex(),
      "sh(wpkh(02cca4482dc1e7d54c879c0d9069e3d66c3bf91b2bf46eddc74f18d76c659dfd10))",
    },
  };
  static const std::string kExpTxData = "010000000006fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff0a9a33750a810cd384ca5d93b09513f1eb5d93c669091b29eef710d2391ff7300000000000feffffff0ad4a335556c64c3e2599c3a4c3ddff5b28f616fa55cf2323d2ae642eef74a8f0000000000feffffff030b0000000000000000000000000000000000000000000000000000000000000000000000feffffff020b0000000000000000000000000000000000000000000000000000000000000000000000feffffff010c0000000000000000000000000000000000000000000000000000000000000000000000feffffff050100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a572430100000000000000000000000000000000000000000000000000000000000000aa01000000000000026a00000100000000000000000000000000000000000000000000000000000000000000bb010000000014b18c12001600148aff8eea7bef9ec60d35d7034b2e48e180e93c5d0100000000000000000000000000000000000000000000000000000000000000cc0100000000023e8eb800160014799a8d3f11251b6a6df4ba156a28dd64ad969a910100000000000000000000000000000000000000000000000000000000000000aa010000000006fc2142001600146cd31ad8b8552934f4bd9c8cf84a93cbd7a49de111000000";

  cfd::Initialize();
  ElementsAddressFactory factory(NetType::kLiquidV1);

  try {
    ConfidentialTransactionContext tx("010000000001fff7f7881a8099afa6940d42d1e7f6362bec38171ea3edf433541db4e4ad969f0000000000feffffff010100000000000000000000000000000000000000000000000000000000000000aa010000000006b22c2000160014c6598809d09edaacb8f4f4d5b9b81e4413a5724311000000");
    std::vector<cfd::UtxoData> utxos;
    utxos.resize(kFundCoinSelectElementsTestVector3.size());
    uint32_t i = 0;
    for (const auto& test_data : kFundCoinSelectElementsTestVector3) {
      Txid txid;
      if (!test_data.txid.empty()) {
        txid = Txid(test_data.txid);
      }
      utxos[i].txid = Txid(test_data.txid);
      utxos[i].vout = test_data.vout;
      utxos[i].amount = Amount(test_data.amount);
      utxos[i].asset = ConfidentialAssetId(test_data.asset);
      utxos[i].descriptor = test_data.descriptor;
      utxos[i].address_type = AddressType::kP2shP2wpkhAddress;
      ++i;
    }

    ExtPubkey key = ExtPubkey("xpub661MyMwAqRbcGB88KaFbLGiYAat55APKhtWg4uYMkXAmfuSTbq2QYsn9sKJCj1YqZPafsboef4h4YbXXhNhPwMbkHTpkf3zLhx7HvFw1NDy");
    ConfidentialAssetId fee_asset = exp_dummy_asset_a;
    std::map<std::string, Amount> map_target_value;
    map_target_value.emplace(exp_dummy_asset_a.GetHex(), Amount(int64_t{115800000}));
    map_target_value.emplace(exp_dummy_asset_b.GetHex(), Amount(int64_t{347180040}));
    map_target_value.emplace(exp_dummy_asset_c.GetHex(), Amount(int64_t{37654100}));
    Address addr = factory.GetAddress("ex1qcevcszwsnmd2ew857n2mnwq7gsf62ujrkz734h");
    Address addr1 = factory.GetAddress("ex1qdnf34k9c255nfa9anjx0sj5ne0t6f80p5rne4e");
    Address addr2 = factory.GetAddress("ex1q3tlca6nma70vvrf46up5ktjguxqwj0zamt7ktn");
    Address addr3 = factory.GetAddress("ex1q0xdg60c3y5dk5m05hg2k52xavjkedx53t3k40m");
    std::map<std::string, std::string> reserve_txout_address;
    reserve_txout_address.emplace(exp_dummy_asset_a.GetHex(), addr1.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_b.GetHex(), addr2.GetAddress());
    reserve_txout_address.emplace(exp_dummy_asset_c.GetHex(), addr3.GetAddress());
    ElementsConfidentialAddress ct_addr1 = ElementsConfidentialAddress(
        addr, key.DerivePubkey(90).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr1 = ElementsConfidentialAddress(
        addr1, key.DerivePubkey(91).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr2 = ElementsConfidentialAddress(
        addr2, key.DerivePubkey(92).GetPubkey());
    ElementsConfidentialAddress reserve_ct_addr3 = ElementsConfidentialAddress(
        addr3, key.DerivePubkey(93).GetPubkey());
    std::vector<UtxoData> selected_utxos;
    std::vector<ElementsUtxoAndOption> selected_txin_utxos;
    ElementsUtxoAndOption txin_utxo;
    txin_utxo.utxo.txid = Txid("9f96ade4b41d5433f4eda31e1738ec2b36f6e7d1420d94a6af99801a88f7f7ff");
    txin_utxo.utxo.amount = Amount(int64_t{112340000});
    txin_utxo.utxo.asset = exp_dummy_asset_a;
    txin_utxo.utxo.descriptor = "sh(wpkh([ef735203/0'/0'/7']022c2409fbf657ba25d97bb3dab5426d20677b774d4fc7bd3bfac27ff96ada3dd1))#4z2vy08x";
    txin_utxo.utxo.address_type = AddressType::kP2shP2wpkhAddress;
    selected_txin_utxos.push_back(txin_utxo);
    selected_utxos.push_back(txin_utxo.utxo);
    double fee_rate = 0.15;
    Amount estimate_fee;
    UtxoFilter filter;
    std::vector<std::string> append_txout_addresses;
    CoinSelectionOption option;
    option.InitializeConfidentialTxSizeInfo();
    option.SetEffectiveFeeBaserate(fee_rate);
    option.SetLongTermFeeBaserate(0.15);
    option.SetFeeAsset(fee_asset);
    option.SetBlindInfo(0, 36);

    ElementsTransactionApi api;
    ConfidentialTransactionController ctx = api.FundRawTransaction(
        tx.GetHex(), utxos, map_target_value, selected_txin_utxos,
        reserve_txout_address, fee_asset, true, fee_rate, &estimate_fee,
        &filter, &option, &append_txout_addresses, NetType::kLiquidV1);

    EXPECT_EQ(kExpTxData, ctx.GetHex());
    EXPECT_EQ(618, estimate_fee.GetSatoshiValue());
    EXPECT_EQ(size_t{3}, append_txout_addresses.size());
    if (append_txout_addresses.size() == size_t{3})
    {
      EXPECT_STREQ(addr1.GetAddress().c_str(), append_txout_addresses[2].c_str());
      EXPECT_STREQ(addr2.GetAddress().c_str(), append_txout_addresses[0].c_str());
      EXPECT_STREQ(addr3.GetAddress().c_str(), append_txout_addresses[1].c_str());
    }

    ConfidentialTransactionContext context(ctx.GetHex());
    std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
    ct_addrs.push_back(ct_addr1);
    ct_addrs.push_back(reserve_ct_addr1);
    ct_addrs.push_back(reserve_ct_addr2);
    ct_addrs.push_back(reserve_ct_addr3);
    context.CollectInputUtxo(selected_utxos);
    context.CollectInputUtxo(utxos);
    context.Blind(&ct_addrs, 1, 0, 36);
    for (const auto& txin : context.GetTxInList()) {
      context.SignWithKey(OutPoint(txin.GetTxid(), txin.GetVout()),
          Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
          Privkey::FromWif(
              "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5"));
    }
    if ((context.GetVsize() != 4120) && (context.GetVsize() != 4121) &&
        (context.GetVsize() != 4122)) {
      EXPECT_EQ(100, context.GetVsize());
    }
    // EXPECT_STREQ("", context.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    return;
  }
}